

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-tool.cc
# Opt level: O0

bool __thiscall string_parser::next(string_parser *this,string *str,uint64_t *offset,size_t *room)

{
  byte bVar1;
  exception *e;
  size_t *room_local;
  uint64_t *offset_local;
  string *str_local;
  string_parser *this_local;
  
  *offset = this->_offset;
  std::__cxx11::string::clear();
  do_read(this,true,false);
  do_read(this,false,true);
  do_read(this,false,false);
  do_read(this,false,true);
  *room = this->_offset - *offset;
  std::__cxx11::string::operator=((string *)str,(string *)&this->_str);
  bVar1 = std::__cxx11::string::empty();
  return (bool)((bVar1 ^ 0xff) & 1);
}

Assistant:

bool next(std::string& str, uint64_t& offset, size_t& room)
	{
		offset = _offset; // current offset
		_str.clear();

		try {
			do_read(true,  false); // main string
			do_read(false, true);  // zeros
			do_read(false, false); // sshash pad
			do_read(false, true);  // zeros
		} catch (std::exception& e) {
			std::cerr << "failed to read next string: " << e.what() << '\n';
			return false;
		}

		room = _offset - offset;
		str  = _str;
		return !str.empty();
	}